

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_types.cpp
# Opt level: O0

StatisticObject __thiscall Clasp::SolverStats::at(SolverStats *this,char *k)

{
  bool bVar1;
  ExtendedStats *in_RSI;
  char **in_RDI;
  ExtendedStats *in_stack_ffffffffffffffd8;
  uint64 local_8;
  
  if ((in_RDI[6] == (char *)0x0) || (bVar1 = matchPath<6u>(in_RDI,(char (*) [6])in_RSI), !bVar1)) {
    local_8 = (uint64)CoreStats::at((CoreStats *)in_RSI,(char *)in_RDI);
  }
  else if ((char)in_RSI->domChoices == '\0') {
    local_8 = (uint64)StatisticObject::map<Clasp::ExtendedStats>(in_stack_ffffffffffffffd8);
  }
  else {
    local_8 = (uint64)ExtendedStats::at(in_RSI,(char *)in_RDI);
  }
  return (StatisticObject)local_8;
}

Assistant:

StatisticObject SolverStats::at(const char* k) const {
	if (extra && matchPath(k, "extra")) {
		return !*k ? StatisticObject::map(extra) : extra->at(k);
	}
	else {
		return CoreStats::at(k);
	}
}